

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

void sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank
               (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
               sysbvm_tuple_t operand)

{
  _Bool _Var1;
  int16_t iVar2;
  int16_t iVar3;
  sysbvm_tuple_t sVar4;
  size_t sVar5;
  sysbvm_tuple_t baseType;
  sysbvm_tuple_t temporaryType;
  int16_t vectorType;
  int16_t index;
  sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand;
  sysbvm_tuple_t operand_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  sVar4 = sysbvm_tuple_getType(context,operand);
  if ((sVar4 == (context->roots).functionBytecodeAssemblerVectorOperand) &&
     (_Var1 = sysbvm_tuple_boolean_decode(*(sysbvm_tuple_t *)(operand + 0x50)), !_Var1)) {
    iVar2 = sysbvm_tuple_int16_decode(*(sysbvm_tuple_t *)(operand + 0x10));
    iVar3 = sysbvm_tuple_int16_decode(*(sysbvm_tuple_t *)(operand + 0x18));
    if ((iVar3 == 3) &&
       ((-1 < iVar2 &&
        (sVar5 = sysbvm_orderedCollection_getSize(assembler->temporaries),
        (ulong)(long)iVar2 < sVar5)))) {
      sVar4 = sysbvm_orderedCollection_at(assembler->temporaryTypes,(long)iVar2);
      _Var1 = sysbvm_tuple_isKindOf(context,sVar4,(context->roots).pointerLikeType);
      if (!_Var1) {
        sysbvm_error("Expected a pointer like type for alloca which is going to be lowered.");
      }
      sysbvm_orderedCollection_atPut
                (assembler->temporaryTypes,(long)iVar2,*(sysbvm_tuple_t *)(sVar4 + 0xf8));
    }
  }
  return;
}

Assistant:

static void sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t operand)
{
    if(sysbvm_tuple_getType(context, operand) != context->roots.functionBytecodeAssemblerVectorOperand)
        return;

    sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand = (sysbvm_functionBytecodeAssemblerVectorOperand_t*)operand;
    if(sysbvm_tuple_boolean_decode(vectorOperand->allocaPointerRankIsLowered))
        return;

    int16_t index = sysbvm_tuple_int16_decode(vectorOperand->index);
    int16_t vectorType = sysbvm_tuple_int16_decode(vectorOperand->vectorType);
    if(vectorType != SYSBVM_OPERAND_VECTOR_LOCAL || index < 0 || (size_t)index >= sysbvm_orderedCollection_getSize(assembler->temporaries))
        return;

    sysbvm_tuple_t temporaryType = sysbvm_orderedCollection_at(assembler->temporaryTypes, index);
    if(!sysbvm_tuple_isKindOf(context, temporaryType, context->roots.pointerLikeType))
        sysbvm_error("Expected a pointer like type for alloca which is going to be lowered.");

    sysbvm_tuple_t baseType = ((sysbvm_pointerLikeType_t*)temporaryType)->baseType;
    sysbvm_orderedCollection_atPut(assembler->temporaryTypes, index, baseType);
}